

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_init_gnss_gps(fsnav_gnss_gps *gps,size_t max_sat_count,size_t max_eph_count)

{
  fsnav_gnss_sat *pfVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  pfVar1 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  gps->max_sat_count = 0;
  gps->max_eph_count = 0;
  gps->sat = pfVar1;
  if (pfVar1 != (fsnav_gnss_sat *)0x0) {
    gps->max_sat_count = max_sat_count;
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < max_sat_count; uVar4 = uVar4 + 1) {
      fsnav_init_gnss_sat((fsnav_gnss_sat *)((long)gps->sat->x + lVar3 + -0x30));
      max_sat_count = gps->max_sat_count;
      lVar3 = lVar3 + 0x90;
    }
    lVar5 = max_sat_count + 1;
    lVar3 = 0;
    do {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) {
        gps->max_eph_count = max_eph_count;
        gps->iono_valid = '\0';
        gps->clock_corr_valid = '\0';
        gps->obs_types = (char (*) [4])0x0;
        gps->obs_count = 0;
        return '\x01';
      }
      pvVar2 = calloc(max_eph_count,8);
      *(void **)((long)gps->sat->x + lVar3 + -0x30) = pvVar2;
      lVar3 = lVar3 + 0x90;
    } while (pvVar2 != (void *)0x0);
  }
  return '\0';
}

Assistant:

char fsnav_init_gnss_gps(fsnav_gnss_gps* gps, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	gps->sat = NULL;
	gps->max_sat_count = 0;
	gps->max_eph_count = 0;

	// try to allocate memory for satellite data
	gps->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (gps->sat == NULL)
		return 0;
	gps->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < gps->max_sat_count; i++) 
		fsnav_init_gnss_sat(gps->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < gps->max_sat_count; i++) {
		gps->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (gps->sat[i].eph == NULL)
			return 0;
	}
	gps->max_eph_count = max_eph_count;

	// observation types
	gps->obs_types = NULL;
	gps->obs_count = 0;

	// validity flags
	gps->iono_valid = 0;
	gps->clock_corr_valid = 0;

	return 1;
}